

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

void __thiscall
icu_63::TimeZoneFormat::appendOffsetDigits
          (TimeZoneFormat *this,UnicodeString *buf,int32_t n,uint8_t minDigits)

{
  int iVar1;
  undefined7 in_register_00000009;
  int iVar2;
  
  iVar1 = (int)CONCAT71(in_register_00000009,minDigits);
  iVar2 = ~(uint)(9 < n) + iVar1;
  if (iVar2 != 0 && SCARRY4(~(uint)(9 < n),iVar1) == iVar2 < 0) {
    do {
      icu_63::UnicodeString::append(buf,this->fGMTOffsetDigits[0]);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  if (9 < n) {
    icu_63::UnicodeString::append
              (buf,*(UChar32 *)
                    ((long)this->fGMTOffsetDigits +
                    (ulong)((uint)((ulong)(uint)n * 0xcccccccd >> 0x21) & 0xfffffffc)));
  }
  icu_63::UnicodeString::append(buf,this->fGMTOffsetDigits[n % 10]);
  return;
}

Assistant:

void
TimeZoneFormat::appendOffsetDigits(UnicodeString& buf, int32_t n, uint8_t minDigits) const {
    U_ASSERT(n >= 0 && n < 60);
    int32_t numDigits = n >= 10 ? 2 : 1;
    for (int32_t i = 0; i < minDigits - numDigits; i++) {
        buf.append(fGMTOffsetDigits[0]);
    }
    if (numDigits == 2) {
        buf.append(fGMTOffsetDigits[n / 10]);
    }
    buf.append(fGMTOffsetDigits[n % 10]);
}